

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::TruncateLogFile(char *path,int64 limit,int64 keep)

{
  int iVar1;
  size_t __n;
  int *piVar2;
  ostream *poVar3;
  ssize_t sVar4;
  SendMethod in_R9;
  LogMessage local_21d8;
  code *local_21c8;
  undefined8 uStack_21c0;
  LogMessage local_21b8;
  LogMessage local_21a8;
  code *local_2198;
  undefined8 uStack_2190;
  LogMessage local_2188;
  int local_2178;
  int local_2174;
  int bytesout;
  int bytesin;
  code *local_2160;
  undefined8 uStack_2158;
  LogMessage local_2150;
  code *local_2140;
  undefined8 uStack_2138;
  LogMessage local_2130;
  LogMessage local_2120 [2];
  code *local_2100;
  undefined8 uStack_20f8;
  LogMessage local_20f0;
  int local_20dc;
  char *pcStack_20d8;
  int fd;
  char *procfd_prefix;
  long lStack_20c8;
  int flags;
  int64 write_offset;
  int64 read_offset;
  char copybuf [8192];
  undefined1 local_b0 [4];
  int kCopyBlockSize;
  stat statbuf;
  int64 keep_local;
  int64 limit_local;
  char *path_local;
  
  copybuf[0x1ffc] = '\0';
  copybuf[0x1ffd] = ' ';
  copybuf[0x1ffe] = '\0';
  copybuf[0x1fff] = '\0';
  procfd_prefix._4_4_ = 2;
  pcStack_20d8 = "/proc/self/fd/";
  statbuf.__glibc_reserved[2] = keep;
  __n = strlen("/proc/self/fd/");
  iVar1 = strncmp("/proc/self/fd/",path,__n);
  if (iVar1 != 0) {
    procfd_prefix._4_4_ = procfd_prefix._4_4_ | 0x20000;
  }
  local_20dc = open(path,procfd_prefix._4_4_);
  if (local_20dc == -1) {
    piVar2 = __errno_location();
    if (*piVar2 == 0x1b) {
      iVar1 = truncate(path,0);
      if (iVar1 == -1) {
        local_2100 = LogMessage::SendToLog;
        uStack_20f8 = 0;
        ErrnoLogMessage::ErrnoLogMessage
                  ((ErrnoLogMessage *)&local_20f0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                   ,0x7c3,2,0,in_R9);
        poVar3 = LogMessage::stream(&local_20f0);
        poVar3 = std::operator<<(poVar3,"Unable to truncate ");
        std::operator<<(poVar3,path);
        ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_20f0);
      }
      else {
        LogMessage::LogMessage
                  (local_2120,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                   ,0x7c5,2);
        poVar3 = LogMessage::stream(local_2120);
        poVar3 = std::operator<<(poVar3,"Truncated ");
        poVar3 = std::operator<<(poVar3,path);
        std::operator<<(poVar3," due to EFBIG error");
        LogMessage::~LogMessage(local_2120);
      }
    }
    else {
      local_2140 = LogMessage::SendToLog;
      uStack_2138 = 0;
      ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_2130,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                 ,0x7c8,2,0,in_R9);
      poVar3 = LogMessage::stream(&local_2130);
      poVar3 = std::operator<<(poVar3,"Unable to open ");
      std::operator<<(poVar3,path);
      ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_2130);
    }
  }
  else {
    iVar1 = fstat(local_20dc,(stat *)local_b0);
    if (iVar1 == -1) {
      local_2160 = LogMessage::SendToLog;
      uStack_2158 = 0;
      ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_2150,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                 ,0x7ce,2,0,in_R9);
      poVar3 = LogMessage::stream(&local_2150);
      std::operator<<(poVar3,"Unable to fstat()");
      ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_2150);
    }
    else if (((((uint)statbuf.st_nlink & 0xf000) == 0x8000) && (limit < (long)statbuf.st_rdev)) &&
            (statbuf.__glibc_reserved[2] < (long)statbuf.st_rdev)) {
      LogMessage::LogMessage
                ((LogMessage *)&bytesout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                 ,0x7d9);
      poVar3 = LogMessage::stream((LogMessage *)&bytesout);
      poVar3 = std::operator<<(poVar3,"Truncating ");
      poVar3 = std::operator<<(poVar3,path);
      poVar3 = std::operator<<(poVar3," to ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,statbuf.__glibc_reserved[2]);
      std::operator<<(poVar3," bytes");
      LogMessage::~LogMessage((LogMessage *)&bytesout);
      write_offset = statbuf.st_rdev - statbuf.__glibc_reserved[2];
      lStack_20c8 = 0;
      while( true ) {
        sVar4 = pread(local_20dc,&read_offset,0x2000,write_offset);
        local_2174 = (int)sVar4;
        if (local_2174 < 1) break;
        sVar4 = pwrite(local_20dc,&read_offset,(long)local_2174,lStack_20c8);
        local_2178 = (int)sVar4;
        if (local_2178 == -1) {
          local_2198 = LogMessage::SendToLog;
          uStack_2190 = 0;
          ErrnoLogMessage::ErrnoLogMessage
                    ((ErrnoLogMessage *)&local_2188,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                     ,0x7e2,2,0,in_R9);
          poVar3 = LogMessage::stream(&local_2188);
          poVar3 = std::operator<<(poVar3,"Unable to write to ");
          std::operator<<(poVar3,path);
          ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_2188);
          break;
        }
        if (local_2178 != local_2174) {
          LogMessage::LogMessage
                    (&local_21a8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                     ,0x7e5,2);
          poVar3 = LogMessage::stream(&local_21a8);
          poVar3 = std::operator<<(poVar3,"Expected to write ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2174);
          poVar3 = std::operator<<(poVar3,", wrote ");
          std::ostream::operator<<(poVar3,local_2178);
          LogMessage::~LogMessage(&local_21a8);
        }
        write_offset = local_2174 + write_offset;
        lStack_20c8 = local_2178 + lStack_20c8;
      }
      if (local_2174 == -1) {
        local_21c8 = LogMessage::SendToLog;
        uStack_21c0 = 0;
        ErrnoLogMessage::ErrnoLogMessage
                  ((ErrnoLogMessage *)&local_21b8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                   ,0x7ea,2,0,in_R9);
        poVar3 = LogMessage::stream(&local_21b8);
        poVar3 = std::operator<<(poVar3,"Unable to read from ");
        std::operator<<(poVar3,path);
        ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_21b8);
      }
      iVar1 = ftruncate(local_20dc,lStack_20c8);
      if (iVar1 == -1) {
        ErrnoLogMessage::ErrnoLogMessage
                  ((ErrnoLogMessage *)&local_21d8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                   ,0x7f0,2,0,in_R9);
        poVar3 = LogMessage::stream(&local_21d8);
        poVar3 = std::operator<<(poVar3,"Unable to truncate ");
        std::operator<<(poVar3,path);
        ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_21d8);
      }
    }
    close(local_20dc);
  }
  return;
}

Assistant:

void TruncateLogFile(const char *path, int64 limit, int64 keep) {
#ifdef HAVE_UNISTD_H
  struct stat statbuf;
  const int kCopyBlockSize = 8 << 10;
  char copybuf[kCopyBlockSize];
  int64 read_offset, write_offset;
  // Don't follow symlinks unless they're our own fd symlinks in /proc
  int flags = O_RDWR;
  // TODO(hamaji): Support other environments.
#ifdef OS_LINUX
  const char *procfd_prefix = "/proc/self/fd/";
  if (strncmp(procfd_prefix, path, strlen(procfd_prefix))) flags |= O_NOFOLLOW;
#endif

  int fd = open(path, flags);
  if (fd == -1) {
    if (errno == EFBIG) {
      // The log file in question has got too big for us to open. The
      // real fix for this would be to compile logging.cc (or probably
      // all of base/...) with -D_FILE_OFFSET_BITS=64 but that's
      // rather scary.
      // Instead just truncate the file to something we can manage
      if (truncate(path, 0) == -1) {
        PLOG(ERROR) << "Unable to truncate " << path;
      } else {
        LOG(ERROR) << "Truncated " << path << " due to EFBIG error";
      }
    } else {
      PLOG(ERROR) << "Unable to open " << path;
    }
    return;
  }

  if (fstat(fd, &statbuf) == -1) {
    PLOG(ERROR) << "Unable to fstat()";
    goto out_close_fd;
  }

  // See if the path refers to a regular file bigger than the
  // specified limit
  if (!S_ISREG(statbuf.st_mode)) goto out_close_fd;
  if (statbuf.st_size <= limit)  goto out_close_fd;
  if (statbuf.st_size <= keep) goto out_close_fd;

  // This log file is too large - we need to truncate it
  LOG(INFO) << "Truncating " << path << " to " << keep << " bytes";

  // Copy the last "keep" bytes of the file to the beginning of the file
  read_offset = statbuf.st_size - keep;
  write_offset = 0;
  int bytesin, bytesout;
  while ((bytesin = pread(fd, copybuf, sizeof(copybuf), read_offset)) > 0) {
    bytesout = pwrite(fd, copybuf, bytesin, write_offset);
    if (bytesout == -1) {
      PLOG(ERROR) << "Unable to write to " << path;
      break;
    } else if (bytesout != bytesin) {
      LOG(ERROR) << "Expected to write " << bytesin << ", wrote " << bytesout;
    }
    read_offset += bytesin;
    write_offset += bytesout;
  }
  if (bytesin == -1) PLOG(ERROR) << "Unable to read from " << path;

  // Truncate the remainder of the file. If someone else writes to the
  // end of the file after our last read() above, we lose their latest
  // data. Too bad ...
  if (ftruncate(fd, write_offset) == -1) {
    PLOG(ERROR) << "Unable to truncate " << path;
  }

 out_close_fd:
  close(fd);
#else
  LOG(ERROR) << "No log truncation support.";
#endif
}